

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.c
# Opt level: O0

void * handlecliThreadProc(void *pHandlecliThreadParam)

{
  SOCKET sock;
  void *pParam;
  SOCKET sockcli;
  _func_int_SOCKET_void_ptr *handlecli;
  void *pHandlecliThreadParam_local;
  
  sock = *(SOCKET *)((long)pHandlecliThreadParam + 8);
  (**pHandlecliThreadParam)(sock,*(undefined8 *)((long)pHandlecliThreadParam + 0x10));
  free(pHandlecliThreadParam);
  disconnectclifromtcpsrv(sock);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE handlecliThreadProc(void* pHandlecliThreadParam)
{
	int (*handlecli)(SOCKET, void*) = ((HANDLECLITHREADPARAM*)pHandlecliThreadParam)->handlecli;
	SOCKET sockcli = ((HANDLECLITHREADPARAM*)pHandlecliThreadParam)->sockcli;
	void* pParam = ((HANDLECLITHREADPARAM*)pHandlecliThreadParam)->pParam;

	if (handlecli(sockcli, pParam) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_WARNING_OSNET(("handlecliThreadProc warning (%s) : %s\n", 
			strtime_m(), 
			"Error while communicating with a client. "));
	}

	free(pHandlecliThreadParam);
	if (disconnectclifromtcpsrv(sockcli) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_WARNING_OSNET(("handlecliThreadProc warning (%s) : %s\n", 
			strtime_m(), 
			"Error disconnecting a client. "));
	}

	return 0;
}